

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

HanabiMove __thiscall hanabi_learning_env::HanabiGame::ConstructMove(HanabiGame *this,int uid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ESI;
  HanabiGame *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HanabiMove local_8;
  
  if ((in_ESI < 0) ||
     (iVar1 = MaxMoves((HanabiGame *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
     iVar1 <= in_ESI)) {
    HanabiMove::HanabiMove(&local_8,kInvalid,-1,-1,-1,-1);
    return local_8;
  }
  iVar1 = MaxDiscardMoves(in_RDI);
  if (in_ESI < iVar1) {
    HanabiMove::HanabiMove(&local_8,kDiscard,(int8_t)in_ESI,-1,-1,-1);
    return local_8;
  }
  iVar2 = MaxDiscardMoves(in_RDI);
  iVar2 = in_ESI - iVar2;
  iVar1 = iVar2;
  iVar3 = MaxPlayMoves(in_RDI);
  if (iVar1 < iVar3) {
    HanabiMove::HanabiMove(&local_8,kPlay,(int8_t)iVar2,-1,-1,-1);
    return local_8;
  }
  iVar1 = MaxPlayMoves(in_RDI);
  iVar2 = iVar2 - iVar1;
  iVar1 = iVar2;
  iVar3 = MaxRevealColorMoves(in_RDI);
  if (iVar1 < iVar3) {
    iVar1 = NumColors(in_RDI);
    iVar3 = NumColors(in_RDI);
    HanabiMove::HanabiMove
              (&local_8,kRevealColor,-1,(char)(iVar2 / iVar1) + '\x01',(int8_t)(iVar2 % iVar3),-1);
    return local_8;
  }
  iVar1 = MaxRevealColorMoves(in_RDI);
  iVar3 = NumRanks(in_RDI);
  iVar4 = NumRanks(in_RDI);
  HanabiMove::HanabiMove
            (&local_8,kRevealRank,-1,(char)((iVar2 - iVar1) / iVar3) + '\x01',-1,
             (int8_t)((iVar2 - iVar1) % iVar4));
  return local_8;
}

Assistant:

HanabiMove HanabiGame::ConstructMove(int uid) const {
  if (uid < 0 || uid >= MaxMoves()) {
    return HanabiMove(HanabiMove::kInvalid, /*card_index=*/-1,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  if (uid < MaxDiscardMoves()) {
    return HanabiMove(HanabiMove::kDiscard, /*card_index=*/uid,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  uid -= MaxDiscardMoves();
  if (uid < MaxPlayMoves()) {
    return HanabiMove(HanabiMove::kPlay, /*card_index=*/uid,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  uid -= MaxPlayMoves();
  if (uid < MaxRevealColorMoves()) {
    return HanabiMove(HanabiMove::kRevealColor, /*card_index=*/-1,
                      /*target_offset=*/1 + uid / NumColors(),
                      /*color=*/uid % NumColors(), /*rank=*/-1);
  }
  uid -= MaxRevealColorMoves();
  return HanabiMove(HanabiMove::kRevealRank, /*card_index=*/-1,
                    /*target_offset=*/1 + uid / NumRanks(),
                    /*color=*/-1, /*rank=*/uid % NumRanks());
}